

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O1

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Graph::Gotlieb(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *__return_storage_ptr__,Graph *this,int r,int *m,
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              *adjMatrix)

{
  int *piVar1;
  ulong *puVar2;
  _Bit_type *p_Var3;
  _Bit_type _Var4;
  ulong uVar5;
  pointer pvVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  ostream *poVar10;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ostream *poVar15;
  uint uVar16;
  int iVar17;
  long *plVar18;
  ostream *poVar19;
  ostream *poVar20;
  _Bit_type *p_Var21;
  ostream *poVar22;
  int n;
  ostream *poVar23;
  ulong uVar24;
  pointer pvVar25;
  size_type __n;
  long lVar26;
  pointer piVar27;
  pointer piVar28;
  int iVar29;
  bool bVar30;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  copytreeAdjMat;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dmat;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  treeAdjMat;
  vector<int,_std::allocator<int>_> x;
  allocator_type local_e2;
  allocator_type local_e1;
  size_type local_e0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_d8;
  pointer local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  pointer local_98;
  pointer local_90;
  int *local_88;
  vector<int,_std::allocator<int>_> local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  Graph *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  *m = 0;
  __n = (size_type)r;
  local_68.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_d0 = (pointer)adjMatrix;
  local_88 = m;
  local_50 = this;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,__n,(value_type_conflict *)&local_68,(allocator_type *)&local_c8);
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__n,(allocator_type *)&local_b0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_68,__n,&local_c8,(allocator_type *)&local_80);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__n,(allocator_type *)&local_80);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_c8,__n,&local_b0,&local_e2);
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  poVar10 = (ostream *)(ulong)(uint)r;
  if (0 < r) {
    p_Var3 = (local_d0->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p;
    lVar13 = 0;
    poVar15 = (ostream *)0x0;
    do {
      _Var4 = p_Var3[(long)poVar15 * 5];
      plVar18 = (long *)(CONCAT44(local_68.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_68.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar13);
      bVar8 = false;
      poVar22 = poVar15;
      do {
        if (!bVar8 && (*(ulong *)(_Var4 + ((ulong)poVar22 >> 6) * 8) >> ((ulong)poVar22 & 0x3f) & 1)
                      != 0) {
          bVar8 = true;
          *(undefined4 *)
           (*(long *)(CONCAT44(local_68.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_68.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                     (long)poVar15 * 0x18) + (long)poVar22 * 4) = 1;
          *(undefined4 *)(*plVar18 + (long)poVar15 * 4) = 1;
        }
        poVar22 = poVar22 + 1;
        plVar18 = plVar18 + 3;
      } while (poVar10 != poVar22);
      poVar15 = poVar15 + 1;
      lVar13 = lVar13 + 0x18;
    } while (poVar15 != poVar10);
  }
  if (0 < r) {
    poVar15 = (ostream *)0x0;
    do {
      lVar13 = *(long *)(CONCAT44(local_68.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_68.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                        (long)poVar15 * 0x18);
      lVar26 = *(long *)(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + (long)poVar15 * 6);
      poVar22 = (ostream *)0x0;
      do {
        *(undefined4 *)(lVar26 + (long)poVar22 * 4) = *(undefined4 *)(lVar13 + (long)poVar22 * 4);
        poVar22 = poVar22 + 1;
      } while (poVar10 != poVar22);
      poVar15 = poVar15 + 1;
    } while (poVar15 != poVar10);
  }
  poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,r);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
  if (0 < r) {
    poVar22 = (ostream *)0x0;
    do {
      lVar13 = *(long *)(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + (long)poVar22 * 6);
      poVar19 = (ostream *)0x0;
      do {
        if (*(int *)(lVar13 + (long)poVar19 * 4) == 1) {
          lVar26 = *(long *)(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + (long)poVar19 * 6);
          poVar15 = (ostream *)0x0;
          do {
            if (*(int *)(lVar26 + (long)poVar15 * 4) == 1) {
              *(undefined4 *)(lVar13 + (long)poVar15 * 4) = 1;
              piVar1 = (int *)(lVar26 + (long)poVar15 * 4);
              *piVar1 = -*piVar1;
            }
            poVar15 = poVar15 + 1;
          } while (poVar10 != poVar15);
        }
        poVar19 = poVar19 + 1;
      } while (poVar19 != poVar10);
      poVar22 = poVar22 + 1;
    } while (poVar22 != poVar10);
  }
  if (0 < r) {
    poVar22 = (ostream *)0x0;
    do {
      poVar20 = (ostream *)0x0;
      bVar8 = false;
      poVar19 = poVar15;
      do {
        lVar13 = *(long *)(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + (long)poVar20 * 6);
        bVar30 = *(int *)(lVar13 + (long)poVar22 * 4) == 1;
        poVar15 = poVar19;
        bVar9 = bVar8;
        if (bVar30) {
          if (!bVar8) {
            bVar9 = true;
          }
          poVar15 = poVar20;
          if (bVar8) {
            poVar15 = poVar19;
          }
          poVar15 = (ostream *)((ulong)poVar15 & 0xffffffff);
          if ((!(bool)(~bVar8 & 1) && bVar30) && (poVar15 = poVar19, bVar9 = bVar8, bVar8)) {
            poVar23 = (ostream *)0x0;
            do {
              if (*(int *)(lVar13 + (long)poVar23 * 4) == 1) {
                *(undefined4 *)
                 (*(long *)(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + (long)(int)poVar19 * 6) +
                 (long)poVar23 * 4) = 1;
                piVar1 = (int *)(lVar13 + (long)poVar23 * 4);
                *piVar1 = -*piVar1;
              }
              poVar23 = poVar23 + 1;
            } while (poVar10 != poVar23);
          }
        }
        bVar8 = bVar9;
        poVar20 = poVar20 + 1;
        poVar19 = poVar15;
      } while (poVar20 != poVar10);
      poVar22 = poVar22 + 1;
    } while (poVar22 != poVar10);
  }
  if (r < 1) {
    piVar27 = (pointer)0x0;
  }
  else {
    poVar15 = (ostream *)0x0;
    piVar27 = (pointer)0x0;
    do {
      poVar22 = (ostream *)0x0;
      do {
        if (*(int *)(*(long *)(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + (long)poVar15 * 6) +
                    (long)poVar22 * 4) == 1) {
          piVar27 = (pointer)(ulong)((int)piVar27 + 1);
          break;
        }
        poVar22 = poVar22 + 1;
      } while (poVar10 != poVar22);
      poVar15 = poVar15 + 1;
    } while (poVar15 != poVar10);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__n,(allocator_type *)&local_e2);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_b0,(long)(int)piVar27,&local_80,&local_e1);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0 < r) {
    poVar15 = (ostream *)0x0;
    iVar12 = 0;
    do {
      lVar13 = *(long *)(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + (long)poVar15 * 6);
      poVar22 = (ostream *)0x0;
LAB_001031b8:
      if (*(int *)(lVar13 + (long)poVar22 * 4) != 1) goto code_r0x001031bf;
      lVar26 = *(long *)(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + (long)iVar12 * 6);
      poVar22 = (ostream *)0x0;
      do {
        *(undefined4 *)(lVar26 + (long)poVar22 * 4) = *(undefined4 *)(lVar13 + (long)poVar22 * 4);
        poVar22 = poVar22 + 1;
      } while (poVar10 != poVar22);
      iVar12 = iVar12 + 1;
LAB_001031e9:
      poVar15 = poVar15 + 1;
      if (poVar15 == poVar10) break;
    } while( true );
  }
  piVar28 = piVar27;
  local_e0 = __n;
  local_d8 = __return_storage_ptr__;
  local_90 = piVar27;
  if (0 < r) {
    poVar15 = (ostream *)0x0;
    local_98 = piVar27;
    do {
      if (0 < (int)local_98) {
        lVar13 = 0;
        do {
          if ((*(int *)(*(long *)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar13) +
                       (long)poVar15 * 4) == 0) && (poVar15 == (ostream *)(ulong)((int)piVar27 - 1))
             ) {
            puts("\nError in block 2 while searching for independent meshes");
          }
          lVar13 = lVar13 + 0x18;
        } while ((long)piVar27 * 0x18 != lVar13);
      }
      poVar15 = poVar15 + 1;
      piVar28 = local_98;
    } while (poVar15 != poVar10);
  }
  if (0 < (int)piVar28) {
    local_98 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    lVar13 = 0;
    bVar8 = false;
    do {
      if (0 < r) {
        lVar26 = *(long *)(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar13 * 6);
        p_Var3 = (local_d0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        poVar15 = (ostream *)0x0;
        do {
          if (*(int *)(lVar26 + (long)poVar15 * 4) == 1) {
            uVar24 = 1L << ((byte)poVar15 & 0x3f);
            poVar22 = (ostream *)0x0;
            p_Var21 = p_Var3;
            do {
              uVar5 = *(ulong *)(*p_Var21 + ((ulong)poVar15 >> 6) * 8);
              if ((((uVar5 & uVar24) != 0) && (*(int *)(lVar26 + (long)poVar22 * 4) == 0)) &&
                 (bVar9 = !bVar8, bVar8 = true, bVar9)) {
                *(ulong *)(*p_Var21 + ((ulong)poVar15 >> 6) * 8) = uVar5 | uVar24;
                puVar2 = (ulong *)(p_Var3[(long)poVar15 * 5] + ((ulong)poVar22 >> 6) * 8);
                *puVar2 = *puVar2 | 1L << ((byte)poVar22 & 0x3f);
              }
              poVar22 = poVar22 + 1;
              p_Var21 = p_Var21 + 5;
            } while (poVar10 != poVar22);
          }
          poVar15 = poVar15 + 1;
        } while (poVar15 != poVar10);
      }
      lVar13 = lVar13 + 1;
    } while ((pointer)lVar13 != local_90);
  }
  if (0 < r) {
    lVar26 = 8;
    lVar13 = 0;
    do {
      lVar7 = CONCAT44(local_68.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_68.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (*(long *)(lVar7 + lVar26) - *(long *)(lVar7 + -8 + lVar26) >> 2 != local_e0) {
        __assert_fail("static_cast<size_t>(r)==treeAdjMat_i.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                      ,200,"vector<vector<int>> Graph::Gotlieb(int, int *, vector<vector<bool>> &)")
        ;
      }
      iVar12 = countDifference<std::vector<int,std::allocator<int>>,std::vector<bool,std::allocator<bool>>>
                         (local_50,(vector<int,_std::allocator<int>_> *)(lVar7 + lVar26 + -8),
                          (vector<bool,_std::allocator<bool>_> *)
                          ((long)(local_d0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                          lVar13));
      *local_88 = *local_88 + iVar12;
      lVar26 = lVar26 + 0x18;
      lVar13 = lVar13 + 0x28;
    } while ((long)poVar10 * 0x28 != lVar13);
  }
  iVar12 = *local_88;
  *local_88 = iVar12 / 2;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_d8,local_e0,(allocator_type *)&local_80);
  iVar29 = r + 1;
  uVar16 = (iVar12 / 2) * iVar29;
  local_e0 = (size_type)uVar16;
  iVar12 = uVar16 + 1;
  if (0 < r) {
    lVar13 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((local_d8->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar13),(long)iVar12);
      lVar13 = lVar13 + 0x18;
    } while ((long)poVar10 * 0x18 != lVar13);
  }
  pvVar11 = local_d8;
  if (r < iVar12) {
    pvVar6 = (local_d8->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar14 = 0;
    do {
      if (0 < r) {
        lVar13 = 0;
        do {
          *(undefined4 *)
           (*(long *)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data + lVar13) + (long)iVar14 * 4) = 0xfffffffc;
          lVar13 = lVar13 + 0x18;
        } while ((long)poVar10 * 0x18 != lVar13);
      }
      iVar14 = iVar14 + iVar29;
    } while (iVar14 < iVar12 - r);
  }
  iVar12 = (int)local_e0;
  if (0 < r) {
    pvVar6 = (local_d8->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      *(undefined4 *)
       (*(long *)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar13) + (long)iVar12 * 4) = 0xfffffffb;
      lVar13 = lVar13 + 0x18;
    } while ((long)poVar10 * 0x18 != lVar13);
  }
  if (0 < iVar12) {
    iVar14 = 1;
    do {
      if (0 < r) {
        pvVar6 = (local_d8->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = (ostream *)0x0;
        do {
          lVar13 = *(long *)(CONCAT44(local_68.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_68.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                            (long)poVar15 * 0x18);
          lVar26 = *(long *)&pvVar6[(long)poVar15].super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data;
          poVar22 = (ostream *)0x0;
          do {
            *(undefined4 *)(lVar26 + (long)iVar14 * 4 + (long)poVar22 * 4) =
                 *(undefined4 *)(lVar13 + (long)poVar22 * 4);
            poVar22 = poVar22 + 1;
          } while (poVar10 != poVar22);
          poVar15 = poVar15 + 1;
        } while (poVar15 != poVar10);
      }
      iVar14 = iVar14 + iVar29;
    } while (iVar14 <= iVar12);
  }
  if (0 < r) {
    local_d0 = (pointer)(local_d0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    poVar22 = (ostream *)0x1;
    lVar13 = 0x18;
    iVar14 = 1;
    poVar15 = (ostream *)0x0;
    do {
      poVar19 = poVar15 + 1;
      if (poVar19 < poVar10) {
        lVar26 = *(long *)&local_d0[(long)poVar15].super__Bvector_base<std::allocator<bool>_>.
                           _M_impl.super__Bvector_impl_data;
        pvVar6 = (local_d8->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        plVar18 = (long *)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + lVar13);
        poVar20 = poVar22;
        do {
          if (((*(ulong *)(lVar26 + ((ulong)poVar20 >> 6) * 8) >> ((ulong)poVar20 & 0x3f) & 1) != 0)
             && (*(int *)(*(long *)(CONCAT44(local_68.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_68.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   (long)poVar15 * 0x18) + (long)poVar20 * 4) == 0)) {
            *(undefined4 *)
             (*(long *)&pvVar6[(long)poVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + (long)((int)poVar20 + iVar14) * 4) = 1;
            *(undefined4 *)(*plVar18 + (long)(iVar14 + (int)poVar15) * 4) = 1;
            iVar14 = iVar14 + iVar29;
          }
          poVar20 = poVar20 + 1;
          plVar18 = plVar18 + 3;
        } while (poVar10 != poVar20);
      }
      poVar22 = poVar22 + 1;
      lVar13 = lVar13 + 0x18;
      poVar15 = poVar19;
    } while (poVar19 != poVar10);
  }
  if (0 < iVar12) {
    iVar14 = 1;
    do {
      lVar13 = (long)iVar14 * 4;
      do {
        if (r < 1) break;
        pvVar6 = (local_d8->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar8 = true;
        poVar15 = (ostream *)0x0;
        do {
          poVar22 = (ostream *)0x0;
          iVar17 = 0;
          do {
            iVar17 = iVar17 + (uint)(*(int *)(*(long *)&pvVar6[(long)poVar15].
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + lVar13 + (long)poVar22 * 4) == 1);
            poVar22 = poVar22 + 1;
          } while (poVar10 != poVar22);
          if (iVar17 == 1) {
            lVar26 = *(long *)&pvVar6[(long)poVar15].super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + lVar13;
            poVar22 = (ostream *)0x0;
            pvVar25 = pvVar6;
            do {
              if (*(int *)(lVar26 + (long)poVar22 * 4) == 1) {
                bVar8 = false;
                *(undefined4 *)(lVar26 + (long)poVar22 * 4) = 0;
                *(undefined4 *)
                 (*(long *)&(pvVar25->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data + (long)poVar15 * 4 + (long)iVar14 * 4) = 0;
              }
              poVar22 = poVar22 + 1;
              pvVar25 = pvVar25 + 1;
            } while (poVar10 != poVar22);
          }
          poVar15 = poVar15 + 1;
        } while (poVar15 != poVar10);
      } while (!bVar8);
      iVar14 = iVar14 + iVar29;
    } while (iVar14 <= iVar12);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_b0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_c8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pvVar11;
code_r0x001031bf:
  poVar22 = poVar22 + 1;
  if (poVar10 == poVar22) goto LAB_001031e9;
  goto LAB_001031b8;
}

Assistant:

vector<vector<int>> Gotlieb(int r, int *m, vector<vector<bool>>& adjMatrix)
    {
        *m = 0; int i, j, k, c, nu, done, f, n;
        vector<int> x(r, 0);
        //Block 1
        vector<vector<int>> treeAdjMat(r, vector<int>(r));
        vector<vector<int>> copytreeAdjMat(r, vector<int>(r));
        for (i=0; i < r; i++)
        {
            done = 0;
            for (j=i; j < r; j++)
            {
                if(adjMatrix[i][j]==1 && done==0){
                    treeAdjMat[i][j]=1;
                    treeAdjMat[j][i]=1;
                    done=1;
                }
            }
        }
        //Block 2
        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                assert(i < r);
                copytreeAdjMat[i][j]=treeAdjMat[i][j];
            }
        }
        cout << r << "\n";

        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1)
                {
                    for(k=0; k<r; k++)
                        if(copytreeAdjMat[j][k]==1){
                            copytreeAdjMat[i][k]=copytreeAdjMat[j][k];
                            copytreeAdjMat[j][k]=-copytreeAdjMat[j][k];
                        }
                }
            }
        }

        // now join together the strands that are part of a single cord
        for(j=0; j<r; j++){
            bool found = false;
            for(i=0; i<r; i++)
            {
                if(copytreeAdjMat[i][j]==1 && !found)
                {
                    k=i;
                    found=true;
                }
                else if(copytreeAdjMat[i][j]==1 && found){
                    for(int n=0; n<r; n++)
                        if(copytreeAdjMat[i][n]==1)
                        {
                            copytreeAdjMat[k][n]=copytreeAdjMat[i][n];
                            copytreeAdjMat[i][n]=-copytreeAdjMat[i][n];
                        }
                }
            }
        }

        //count how many lines the matrix c has
        n=0;
        for(i=0;i<r; i++)
        {
            for(j=0;j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1){
                    n++;
                    break;
                }
            }
        }

        vector<vector<int>> dmat(n, vector<int>(r));

        k=0;
        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1)
                {
                    for(f=0; f<r; f++)
                    {
                        dmat[k][f]=copytreeAdjMat[i][f];
                    }
                    k++;
                    break;
                }

            }
        }

        //correctness check
        for(j=0; j<r; j++)
        {
            for(i=0; i<n; i++)
            {
                assert(i<n);
                if(dmat[i][j]==1)
                {
                    continue;
                }
                if(dmat[i][j]==0 && j==n-1)
                {
                    printf("\nError in block 2 while searching for independent meshes\n");
                }
            }
        }

        // So far, we have constructed a spanning tree. Now let focus on finding cycle bases
        /*BLOCK 3*/
        f=0;
        for(i=0;i<n; i++)
            for(j=0;j<r; j++)
                if(dmat[i][j]==1)
                    for(k=0; k<r; k++) /*I'm going to see if I find a side that joins the cords in the j-th column of a*/
                        if(adjMatrix[k][j]==1 && dmat[i][k]==0 && f==0) {
                            /*printf("k=%d\tj=%d\n", k, j);*/
                            adjMatrix[k][j]=1;
                            adjMatrix[j][k]=1;
                            f=1;       /*I have to add only one side!*/
                        }

        for(i=0; i<r; i++)
        {
            vector<int> &treeAdjMat_i = treeAdjMat[i];
            vector<bool> &adjMatrix_i = adjMatrix[i];

            //int n_differences = 0;
            assert(static_cast<size_t>(r)==treeAdjMat_i.size());
            *m += countDifference(treeAdjMat_i,adjMatrix_i);
        }
        int &count = *m;
        count /= 2;
        //count how many sides have to be eliminated to obtain the tree graph = number of independent links
        c = r*count + count + 1;
        vector<vector<int>> indm(r);
        for (int i = 0; i<r; ++i)
        {
            indm[i].resize(c);
        }

        for (j = 0; j < c-r; j = j+r+1)
            for (i = 0; i < r; i++)
                indm[i][j] = -4;
        for (i = 0; i < r; i++)
            indm[i][c-1]=-5;
        for (k = 1; k < c; k=k+r+1)
            for(i = 0; i < r; i++)
                for(j = 0; j < r; j++)
                    indm[i][j+k] = treeAdjMat[i][j];
        // add the sides at a time
        k = 1;
        for(i = 0; i < r; i++)
            for(j = i+1; j<r; j++)
                if(adjMatrix[i][j]==1 && treeAdjMat[i][j]==0)
                {
                    indm[i][j+k]=1;
                    indm[j][i+k]=1;
                    k = k + r + 1;
                }
        /*I remove the segments that are outside the loop (see drawing)*/
        nu = 0; /*nu is the number one on a line*/
        done=0;
        for(k=1; k<c; k=k+r+1){
            while(done==0){
                done=1;
                for(i=0; i<r; i++){
                    for(j=0; j<r; j++)
                    {
                        /*Count how many ones are on a line*/
                        if(indm[i][j+k]==1)
                        {
                            nu++;
                        }
                    }
                    if(nu==1)
                    {
                        /*if there is only one,  make it null*/
                        for(j=0; j<r; j++)    /*I am in the j of 1*/
                        {
                            if(indm[i][j+k]==1){
                                indm[i][j+k]=0;
                                indm[j][i+k]=0;
                                done=0;
                            }
                        }
                    }
                    nu=0;
                }
            }
            done=0;
        }
        return indm;
    }